

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

bool __thiscall
deqp::RobustBufferAccessBehavior::ImageLoadStoreTest::verifyInvalidResults
          (ImageLoadStoreTest *this,GLuint texture_id)

{
  ostringstream *poVar1;
  uchar uVar2;
  uchar uVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  GLuint i;
  int iVar8;
  GLenum GVar9;
  undefined4 extraout_var;
  float *pfVar10;
  GLuint i_1;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  allocator<char> local_2ee;
  allocator<char> local_2ed;
  allocator<char> local_2ec;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  Texture destination_texture;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_2;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  Functions *gl;
  
  iVar8 = (*((this->super_TexelFetchTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar8);
  (*gl->memoryBarrier)(0x20);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"MemoryBarrier",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0xacd);
  switch((this->super_TexelFetchTest).m_test_case) {
  case R8:
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pixels,0x100);
    for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12] = (uchar)lVar12;
    }
    RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    RobustBufferAccessBehavior::Texture::GetData
              (gl,0,0xde1,0x1903,0x1401,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    uVar14 = 0xffffffffffffffff;
    do {
      if (uVar14 == 0xff) {
        bVar15 = true;
        goto LAB_00d601ff;
      }
      lVar12 = uVar14 + 1;
      uVar14 = uVar14 + 1;
    } while (pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12] == '\0');
    bVar15 = 0xff < uVar14;
    local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,". Expected value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," at offset: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
LAB_00d601ff:
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    break;
  case RG8_SNORM:
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)&pixels,0x200);
    for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12 * 2] = (uchar)lVar12;
      pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12 * 2 + 1] = (uchar)lVar12;
    }
    RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    RobustBufferAccessBehavior::Texture::GetData
              (gl,0,0xde1,0x8227,0x1400,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    for (uVar14 = 0; uVar14 != 0x100; uVar14 = uVar14 + 1) {
      uVar2 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14 * 2];
      uVar3 = pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14 * 2 + 1];
      if (uVar2 != '\0' || uVar3 != '\0') {
        bVar15 = 0xff < uVar14;
        local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid value: ");
        std::ostream::operator<<(poVar1,(int)(char)uVar2);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,(int)(char)uVar3);
        std::operator<<((ostream *)poVar1,". Expected value: ");
        std::ostream::operator<<(poVar1,0);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,0);
        std::operator<<((ostream *)poVar1,". At offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00d6046f;
      }
    }
    bVar15 = true;
LAB_00d6046f:
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)&pixels);
    break;
  case R32UI_MULTISAMPLE:
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->super_TexelFetchTest).super_TestCase.m_context;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
    destination_texture.m_id = 0xffffffff;
    destination_texture.m_context =
         (Context *)
         pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    RobustBufferAccessBehavior::Texture::Generate(gl,&destination_texture.m_id);
    RobustBufferAccessBehavior::Texture::Bind(gl,destination_texture.m_id,0xde1);
    RobustBufferAccessBehavior::Texture::Storage(gl,0xde1,1,0x8236,0x10,0x10,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,
               "#version 430 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\nlayout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n\nvoid main()\n{\n    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n\n    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n\n    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(0))))\n    {\n        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n    }\n    else\n    {\n        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n    }\n}\n\n"
               ,&local_2e9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pixels_2,glcts::fixed_sample_locations_values + 1,&local_2ea);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,glcts::fixed_sample_locations_values + 1,&local_2eb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,glcts::fixed_sample_locations_values + 1,&local_2ec);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,glcts::fixed_sample_locations_values + 1,&local_2ed);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,glcts::fixed_sample_locations_values + 1,&local_2ee);
    RobustBufferAccessBehavior::Program::Init
              ((Program *)&pixels,(string *)local_1b0,(string *)&pixels_2,&local_1f0,&local_210,
               &local_230,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&pixels_2);
    std::__cxx11::string::~string((string *)local_1b0);
    RobustBufferAccessBehavior::Program::Use((Program *)&pixels);
    (*gl->bindImageTexture)(0,texture_id,0,'\0',0,35000,0x8236);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xb98);
    (*gl->bindImageTexture)(1,destination_texture.m_id,0,'\0',0,0x88b9,0x8236);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xb9b);
    (*gl->uniform1i)(0,0);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xb9e);
    (*gl->uniform1i)(1,1);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xba1);
    (*gl->dispatchCompute)(0x10,0x10,1);
    GVar9 = (*gl->getError)();
    glu::checkError(GVar9,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xba4);
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&pixels_2,0x100);
    for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
      pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar12] = (uint)lVar12;
    }
    RobustBufferAccessBehavior::Texture::GetData
              (gl,0,0xde1,0x8d94,0x1405,
               pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    uVar14 = 0xffffffffffffffff;
    do {
      if (uVar14 == 0xff) {
        bVar15 = true;
        goto LAB_00d60219;
      }
      lVar12 = uVar14 + 1;
      uVar14 = uVar14 + 1;
    } while (pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar12] == 1);
    bVar15 = 0xff < uVar14;
    local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,". Expected value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," at offset: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
LAB_00d60219:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&pixels_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    RobustBufferAccessBehavior::Texture::~Texture(&destination_texture);
    RobustBufferAccessBehavior::Program::~Program((Program *)&pixels);
    break;
  case RGBA32F:
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&pixels,0x400);
    pfVar10 = (float *)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
      fVar16 = (float)(int)lVar12 * 0.00390625;
      *pfVar10 = fVar16;
      pfVar10[1] = fVar16;
      pfVar10[2] = fVar16;
      pfVar10[3] = fVar16;
      pfVar10 = pfVar10 + 4;
    }
    RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    uVar14 = 0x1908;
    RobustBufferAccessBehavior::Texture::GetData
              (gl,0,0xde1,0x1908,0x1406,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    pfVar10 = (float *)pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    for (uVar13 = 0; uVar13 != 0x100; uVar13 = uVar13 + 1) {
      fVar16 = *pfVar10;
      fVar5 = pfVar10[1];
      fVar6 = pfVar10[2];
      fVar7 = pfVar10[3];
      auVar4._4_4_ = -(uint)(fVar5 != 0.0);
      auVar4._0_4_ = -(uint)(fVar16 != 0.0);
      auVar4._8_4_ = -(uint)(fVar6 != 0.0);
      auVar4._12_4_ = -(uint)(fVar7 != 0.0);
      uVar11 = movmskps((int)uVar14,auVar4);
      uVar14 = (ulong)uVar11;
      if (uVar11 != 0) {
        bVar15 = 0xff < uVar13;
        local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Invalid value: ");
        std::ostream::operator<<(poVar1,fVar16);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,fVar5);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,fVar6);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,fVar7);
        std::operator<<((ostream *)poVar1,". Expected value: ");
        std::ostream::operator<<(poVar1,0.0);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,0.0);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,0.0);
        std::operator<<((ostream *)poVar1,", ");
        std::ostream::operator<<(poVar1,0.0);
        std::operator<<((ostream *)poVar1,". At offset: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00d60399;
      }
      pfVar10 = pfVar10 + 4;
    }
    bVar15 = true;
LAB_00d60399:
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&pixels);
    break;
  case R32UI_MIPMAP:
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels,0x100);
    for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
      *(int *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar12 * 4) = (int)lVar12;
    }
    RobustBufferAccessBehavior::Texture::Bind(gl,texture_id,0xde1);
    RobustBufferAccessBehavior::Texture::GetData
              (gl,1,0xde1,0x8d94,0x1405,
               pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    RobustBufferAccessBehavior::Texture::Bind(gl,0,0xde1);
    uVar14 = 0xffffffffffffffff;
    do {
      if (uVar14 == 0xff) {
        bVar15 = true;
        goto LAB_00d601e5;
      }
      lVar12 = uVar14 * 4;
      uVar14 = uVar14 + 1;
    } while (*(int *)(pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar12 + 4) == 0);
    bVar15 = 0xff < uVar14;
    local_1b0._0_8_ = ((this->super_TexelFetchTest).super_TestCase.m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Invalid value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,". Expected value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," at offset: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
LAB_00d601e5:
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&pixels);
    break;
  default:
    bVar15 = true;
  }
  return bVar15;
}

Assistant:

bool ImageLoadStoreTest::verifyInvalidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();
	gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

	bool result = true;

	if (R8 == m_test_case)
	{
		static const GLuint n_channels = 1;

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = static_cast<GLubyte>(i);
		}

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED, GL_UNSIGNED_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLubyte expected_red = 0;
			const GLubyte drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << (GLuint)drawn_red
													<< ". Expected value: " << (GLuint)expected_red
													<< " at offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RG8_SNORM == m_test_case)
	{
		static const GLuint n_channels = 2;

		std::vector<GLbyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = static_cast<GLubyte>(i);
			pixels[i * n_channels + 1] = static_cast<GLubyte>(i);
		}

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RG, GL_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLbyte expected_red   = 0;
			const GLbyte expected_green = 0;
			const GLbyte drawn_red		= pixels[i * n_channels + 0];
			const GLbyte drawn_green	= pixels[i * n_channels + 1];

			if ((expected_red != drawn_red) || (expected_green != drawn_green))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << (GLint)drawn_red << ", " << (GLint)drawn_green
					<< ". Expected value: " << (GLint)expected_red << ", " << (GLint)expected_green
					<< ". At offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = 0.0f;
			const GLfloat expected_green = 0.0f;
			const GLfloat expected_blue  = 0.0f;
			const GLfloat expected_alpha = 0.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 1;

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = i;
		}

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		Texture::GetData(gl, 1 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 0;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		static const GLuint n_channels = 1;

		/* Compute shader */
		static const GLchar* cs = "#version 430 core\n"
								  "\n"
								  "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
								  "\n"
								  "layout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\n"
								  "layout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n"
								  "\n"
								  "    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n"
								  "    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n"
								  "    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n"
								  "    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n"
								  "\n"
								  "    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(0))))\n"
								  "    {\n"
								  "        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n"
								  "    }\n"
								  "    else\n"
								  "    {\n"
								  "        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n"
								  "    }\n"
								  "}\n"
								  "\n";

		Program program(m_context);
		Texture destination_texture(m_context);

		Texture::Generate(gl, destination_texture.m_id);
		Texture::Bind(gl, destination_texture.m_id, GL_TEXTURE_2D);
		Texture::Storage(gl, GL_TEXTURE_2D, 1, GL_R32UI, width, height, 0 /* depth */);

		program.Init(cs, "", "", "", "", "");
		program.Use();
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_READ_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
		gl.bindImageTexture(1 /* unit */, destination_texture.m_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		gl.uniform1i(0 /* location */, 0 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.uniform1i(1 /* location */, 1 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.dispatchCompute(16, 16, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Pixels buffer initialization */
		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = i;
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 1;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}